

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

void __thiscall wasm::Literal::Literal(Literal *this,LaneArray<8> *lanes)

{
  size_t lane_index;
  long lVar1;
  int64_t iStack_48;
  array<unsigned_char,_16UL> bytes;
  uint8_t bits [16];
  
  (this->type).id = 6;
  lVar1 = 0;
  do {
    getBits(lanes->_M_elems,(uint8_t (*) [16])(bytes._M_elems + 8));
    *(undefined2 *)(bytes._M_elems + lVar1 * 2 + -8) = bytes._M_elems._8_2_;
    lVar1 = lVar1 + 1;
    lanes = (LaneArray<8> *)((long)lanes + 0x18);
  } while (lVar1 != 8);
  (this->field_0).i64 = iStack_48;
  (this->field_0).func.super_IString.str._M_str = (char *)bytes._M_elems._0_8_;
  return;
}

Assistant:

Literal::Literal(const LaneArray<8>& lanes) : type(Type::v128) {
  extractBytes<uint16_t, 8>(v128, lanes);
}